

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

int compareStringsInUtf8(QStringView lhs,QStringView rhs,Comparison mode)

{
  bool bVar1;
  char16_t **ppcVar2;
  storage_type_conflict *psVar3;
  qsizetype qVar4;
  char16_t **ppcVar5;
  qsizetype qVar6;
  int in_R8D;
  long in_FS_OFFSET;
  R_conflict10 RVar7;
  R_conflict10 RVar8;
  char16_t *end2;
  char16_t *end1;
  qsizetype len2;
  qsizetype len1;
  int diff;
  R_conflict10 r2;
  R_conflict10 r1;
  char16_t *src2;
  char16_t *src1;
  QStringView *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  uint uVar9;
  char16_t **ptr;
  storage_type_conflict *end;
  storage_type_conflict *ptr_00;
  long local_78;
  long local_70;
  uint local_5c;
  QStringView local_28;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8D == 0) {
    bVar1 = operator==((QStringView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    local_5c = (uint)!bVar1;
  }
  else {
    local_70 = 0;
    local_78 = 0;
    ppcVar2 = (char16_t **)QStringView::utf16(&local_18);
    psVar3 = QStringView::utf16(&local_28);
    ptr = ppcVar2;
    qVar4 = QStringView::size(&local_18);
    ppcVar5 = (char16_t **)((long)ptr + qVar4 * 2);
    end = psVar3;
    qVar4 = QStringView::size(&local_28);
    ptr_00 = end + qVar4;
    do {
      RVar7 = nextUtf32Character(ptr,(char16_t *)
                                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      RVar8 = nextUtf32Character(ptr,(char16_t *)
                                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      local_70 = RVar7.len + local_70;
      local_78 = RVar8.len + local_78;
      local_5c = RVar7.c - RVar8.c;
      uVar9 = in_stack_ffffffffffffff64 & 0xffffff;
      if ((ppcVar2 < ppcVar5) && (uVar9 = in_stack_ffffffffffffff64 & 0xffffff, psVar3 < ptr_00)) {
        uVar9 = CONCAT13(local_5c == 0,(int3)in_stack_ffffffffffffff64);
      }
      in_stack_ffffffffffffff64 = uVar9;
    } while ((char)(uVar9 >> 0x18) != '\0');
    qVar4 = stringLengthInUtf8(ptr_00,end);
    qVar6 = stringLengthInUtf8(ptr_00,end);
    if ((qVar4 + local_70 != qVar6 + local_78) &&
       (local_5c = 1, qVar4 + local_70 < qVar6 + local_78)) {
      local_5c = 0xffffffff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_5c;
  }
  __stack_chk_fail();
}

Assistant:

static int compareStringsInUtf8(QStringView lhs, QStringView rhs, Comparison mode) noexcept
{
    if (mode == Comparison::ForEquality)
        return lhs == rhs ? 0 : 1;

    // The UTF-16 length is *usually* comparable, but not always. There are
    // pathological cases where they can be wrong, so we need to compare as if
    // we were doing it in UTF-8. That includes the case of UTF-16 surrogate
    // pairs, because qstring.cpp sorts them before U+E000-U+FFFF.
    int diff = 0;
    qsizetype len1 = 0;
    qsizetype len2 = 0;
    const char16_t *src1 = lhs.utf16();
    const char16_t *src2 = rhs.utf16();
    const char16_t *end1 = src1 + lhs.size();
    const char16_t *end2 = src2 + rhs.size();

    // first, scan until we find a difference (if any)
    do {
        auto r1 = nextUtf32Character(src1, end1);
        auto r2 = nextUtf32Character(src2, end2);
        len1 += r1.len;
        len2 += r2.len;
        diff = int(r1.c) - int(r2.c);       // no underflow due to limited range
    } while (src1 < end1 && src2 < end2 && diff == 0);

    // compute the full length past this first difference
    len1 += stringLengthInUtf8(src1, end1);
    len2 += stringLengthInUtf8(src2, end2);
    if (len1 == len2)
        return diff;
    return len1 < len2 ? -1 : 1;
}